

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O2

void __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<int,int>,bool>,absl::lts_20250127::hash_internal::Hash<std::pair<int,int>>,std::equal_to<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,bool>>>
::construct<std::piecewise_construct_t_const&,std::tuple<std::pair<int,int>&>,std::tuple<bool&&>>
          (raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<int,int>,bool>,absl::lts_20250127::hash_internal::Hash<std::pair<int,int>>,std::equal_to<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,bool>>>
           *this,slot_type *slot,piecewise_construct_t *args,tuple<std::pair<int,_int>_&> *args_1,
          tuple<bool_&&> *args_2)

{
  size_t c;
  bool *pbVar1;
  
  c = *(size_t *)this;
  *(undefined8 *)this = 0xffffffffffffff9c;
  pbVar1 = (args_2->super__Tuple_impl<0UL,_bool_&&>).super__Head_base<0UL,_bool_&&,_false>.
           _M_head_impl;
  (slot->value).first =
       *(args_1->super__Tuple_impl<0UL,_std::pair<int,_int>_&>).
        super__Head_base<0UL,_std::pair<int,_int>_&,_false>._M_head_impl;
  (slot->value).second = *pbVar1;
  CommonFields::set_capacity((CommonFields *)this,c);
  return;
}

Assistant:

void set_capacity(size_t c) {
    // We allow setting above the max valid capacity for debugging purposes.
    ABSL_SWISSTABLE_ASSERT(c == 0 || IsValidCapacity(c) ||
                           c > kAboveMaxValidCapacity);
    capacity_ = c;
  }